

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void cleanup(EVP_PKEY_CTX *ctx)

{
  if (world != (World *)0x0) {
    (**(code **)(*(long *)&world->super_Entity + 8))();
  }
  world = (World *)0x0;
  if (uiDisplayer != (UIDisplayer *)0x0) {
    operator_delete(uiDisplayer);
  }
  uiDisplayer = (UIDisplayer *)0x0;
  if (gameplayDisplayer != (GameplayDisplayer *)0x0) {
    operator_delete(gameplayDisplayer);
  }
  gameplayDisplayer = (GameplayDisplayer *)0x0;
  return;
}

Assistant:

void cleanup() {
    delete world;
    world = nullptr;
    
    delete uiDisplayer;
    uiDisplayer = nullptr;
    
    delete gameplayDisplayer;
    gameplayDisplayer = nullptr;
}